

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasHessian_ASA_FSA.c
# Opt level: O3

int resBS1(sunrealtype tt,N_Vector yy,N_Vector yp,N_Vector *yyS,N_Vector *ypS,N_Vector yyB,
          N_Vector ypB,N_Vector rrBS,void *user_dataB)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double *pdVar11;
  double *pdVar12;
  double *pdVar13;
  double *pdVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  
  dVar22 = *user_dataB;
  dVar1 = *(double *)((long)user_dataB + 8);
  pdVar11 = *(double **)((long)yy->content + 0x10);
  dVar2 = pdVar11[2];
  pdVar12 = *(double **)((long)yyB->content + 0x10);
  dVar15 = *pdVar12;
  dVar16 = pdVar12[1];
  dVar3 = pdVar12[3];
  dVar4 = pdVar12[4];
  pdVar13 = *(double **)((long)ypB->content + 0x10);
  dVar5 = pdVar13[1];
  dVar21 = dVar16 - dVar15;
  dVar23 = dVar1 * dVar2;
  dVar20 = *(double *)((long)user_dataB + 0x10) + *(double *)((long)user_dataB + 0x10);
  dVar17 = pdVar11[1];
  dVar24 = dVar20 * dVar17;
  dVar6 = pdVar12[2];
  dVar7 = pdVar12[5];
  dVar8 = pdVar13[3];
  pdVar12 = *(double **)((long)(*yyS)->content + 0x10);
  dVar9 = *pdVar12;
  dVar10 = pdVar13[4];
  pdVar14 = *(double **)((long)rrBS->content + 0x10);
  dVar18 = pdVar12[1];
  dVar19 = pdVar12[2];
  *pdVar14 = ((*pdVar13 + dVar21 * dVar22) - dVar6) + *pdVar11;
  pdVar14[1] = (((dVar5 - dVar23 * dVar21) + dVar16 * -dVar24) - dVar6) + dVar17;
  pdVar14[2] = (dVar17 * -dVar1 * dVar21 - dVar6) + dVar2;
  pdVar14[3] = dVar9 + (((dVar4 - dVar3) * dVar22 + dVar8) - dVar7) + dVar21;
  dVar22 = dVar19 * dVar1;
  pdVar14[4] = dVar16 * -(dVar20 * dVar18 + dVar22) +
               dVar15 * dVar22 + (((dVar23 * dVar3 + dVar10) - (dVar24 + dVar23) * dVar4) - dVar7) +
               dVar18;
  pdVar14[5] = dVar21 * -dVar1 * dVar18 + (dVar3 - dVar4) * dVar17 * dVar1 + -dVar7 + dVar19;
  return 0;
}

Assistant:

static int resBS1(sunrealtype tt, N_Vector yy, N_Vector yp, N_Vector* yyS,
                  N_Vector* ypS, N_Vector yyB, N_Vector ypB, N_Vector rrBS,
                  void* user_dataB)

{
  UserData data;
  sunrealtype y1, y2, y3;
  sunrealtype p1, p2, p3;
  sunrealtype l1, l2, l3, m1, m2, m3;
  sunrealtype lp1, lp2, mp1, mp2;
  sunrealtype s1, s2, s3;
  sunrealtype l21;

  data = (UserData)user_dataB;

  /* The parameters. */
  p1 = data->p[0];
  p2 = data->p[1];
  p3 = data->p[2];

  /* The y vector. */
  y1 = Ith(yy, 1);
  y2 = Ith(yy, 2);
  y3 = Ith(yy, 3);

  /* The lambda vector. */
  l1 = Ith(yyB, 1);
  l2 = Ith(yyB, 2);
  l3 = Ith(yyB, 3);
  /* The mu vector. */
  m1 = Ith(yyB, 4);
  m2 = Ith(yyB, 5);
  m3 = Ith(yyB, 6);

  /* The lambda dot vector. */
  lp1 = Ith(ypB, 1);
  lp2 = Ith(ypB, 2);
  /* The mu dot vector. */
  mp1 = Ith(ypB, 4);
  mp2 = Ith(ypB, 5);

  /* The sensitivity with respect to p1 */
  s1 = Ith(yyS[0], 1);
  s2 = Ith(yyS[0], 2);
  s3 = Ith(yyS[0], 3);

  /* Temporary variables */
  l21 = l2 - l1;

  Ith(rrBS, 1) = lp1 + p1 * l21 - l3 + y1;
  Ith(rrBS, 2) = lp2 - p2 * y3 * l21 - TWO * p3 * y2 * l2 - l3 + y2;
  Ith(rrBS, 3) = -p2 * y2 * l21 - l3 + y3;

  Ith(rrBS, 4) = mp1 + p1 * (-m1 + m2) - m3 + l21 + s1;
  Ith(rrBS, 5) = mp2 + p2 * y3 * m1 - (p2 * y3 + TWO * p3 * y2) * m2 - m3 +
                 p2 * s3 * l1 - (TWO * p3 * s2 + p2 * s3) * l2 + s2;
  Ith(rrBS, 6) = p2 * y2 * (m1 - m2) - m3 - p2 * s2 * l21 + s3;

  return (0);
}